

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O1

void __thiscall QFileDialogPrivate::retranslateStrings(QFileDialogPrivate *this)

{
  QFileDialog *this_00;
  Ui_QFileDialog *pUVar1;
  QAction *pQVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  char cVar6;
  uint uVar7;
  QWidget *this_01;
  uint uVar8;
  ulong uVar9;
  QAbstractProxyModel *pQVar10;
  long in_FS_OFFSET;
  Data *local_108;
  char16_t *pcStack_100;
  qsizetype local_f8;
  QArrayData *local_e8;
  char16_t *pcStack_e0;
  qsizetype local_d8;
  QStringBuilder<QString,_QString> local_c8;
  QString local_90;
  QList<QAction_*> local_78;
  QVariant local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFileDialog **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  cVar6 = QFileDialogOptions::useDefaultNameFilters();
  if (cVar6 != '\0') {
    QFileDialogOptions::defaultNameFilterString();
    QFileDialog::setNameFilter(this_00,&local_c8.a);
    if (&(local_c8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_c8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_c8.a.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  pUVar1 = (this->qFileDialogUi).d;
  if (pUVar1 != (Ui_QFileDialog *)0x0 && (this->super_QDialogPrivate).nativeDialogInUse == false) {
    local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.ptr = (QAction **)&DAT_aaaaaaaaaaaaaaaa;
    this_01 = (QWidget *)QTreeView::header(&pUVar1->treeView->super_QTreeView);
    QWidget::actions(&local_78,this_01);
    pQVar10 = this->proxyModel;
    if (pQVar10 == (QAbstractProxyModel *)0x0) {
      pQVar10 = (QAbstractProxyModel *)this->model;
    }
    local_c8.a.d.d = (Data *)0xffffffffffffffff;
    local_c8.a.d.ptr = (char16_t *)0x0;
    local_c8.a.d.size = 0;
    uVar7 = (**(code **)(*(long *)pQVar10 + 0x80))(pQVar10);
    uVar8 = (int)local_78.d.size + 1U;
    if ((int)uVar7 < (int)((int)local_78.d.size + 1U)) {
      uVar8 = uVar7;
    }
    if (1 < (int)uVar8) {
      uVar9 = 1;
      do {
        qVar5 = local_f8;
        pcVar4 = pcStack_100;
        pDVar3 = local_108;
        pQVar2 = local_78.d.ptr[uVar9 - 1];
        QMetaObject::tr((char *)&local_e8,(char *)&QFileDialog::staticMetaObject,0x6f4a01);
        (**(code **)(*(long *)pQVar10 + 0xa0))(&local_58,pQVar10,uVar9 & 0xffffffff,1,0);
        ::QVariant::toString();
        local_c8.a.d.size = local_d8;
        local_c8.a.d.ptr = pcStack_e0;
        local_c8.a.d.d = (Data *)local_e8;
        local_e8 = (QArrayData *)0x0;
        pcStack_e0 = (char16_t *)0x0;
        local_d8 = 0;
        local_108 = (Data *)0x0;
        pcStack_100 = (char16_t *)0x0;
        local_c8.b.d.d = pDVar3;
        local_c8.b.d.ptr = pcVar4;
        local_f8 = 0;
        local_c8.b.d.size = qVar5;
        QStringBuilder<QString,_QString>::convertTo<QString>(&local_90,&local_c8);
        QAction::setText((QString *)pQVar2);
        if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,0x10);
          }
        }
        QStringBuilder<QString,_QString>::~QStringBuilder(&local_c8);
        ::QVariant::~QVariant(&local_58);
        if (local_e8 != (QArrayData *)0x0) {
          LOCK();
          (local_e8->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_e8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_e8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_e8,2,0x10);
          }
        }
        uVar9 = uVar9 + 1;
      } while (uVar8 != uVar9);
    }
    pQVar2 = this->renameAction;
    QMetaObject::tr((char *)&local_c8,(char *)&QFileDialog::staticMetaObject,0x6f4a07);
    QAction::setText((QString *)pQVar2);
    if (&(local_c8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_c8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_c8.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar2 = this->deleteAction;
    QMetaObject::tr((char *)&local_c8,(char *)&QFileDialog::staticMetaObject,0x6f4a0f);
    QAction::setText((QString *)pQVar2);
    if (&(local_c8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_c8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_c8.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar2 = this->showHiddenAction;
    QMetaObject::tr((char *)&local_c8,(char *)&QFileDialog::staticMetaObject,0x6f4a17);
    QAction::setText((QString *)pQVar2);
    if (&(local_c8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_c8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_c8.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar2 = this->newFolderAction;
    QMetaObject::tr((char *)&local_c8,(char *)&QFileDialog::staticMetaObject,0x6f4a2a);
    QAction::setText((QString *)pQVar2);
    if (&(local_c8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_c8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_c8.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    Ui_QFileDialog::retranslateUi((this->qFileDialogUi).d,&this_00->super_QDialog);
    cVar6 = QFileDialogOptions::isLabelExplicitlySet((DialogLabel)(this->options).value.ptr);
    if (cVar6 != '\0') {
      QFileDialogOptions::labelText((DialogLabel)&local_c8);
      pUVar1 = (this->qFileDialogUi).d;
      if (pUVar1 != (Ui_QFileDialog *)0x0) {
        QLabel::setText(pUVar1->lookInLabel,&local_c8.a);
      }
      if (&(local_c8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_c8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_c8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_c8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_c8.a.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    updateFileNameLabel(this);
    cVar6 = QFileDialogOptions::isLabelExplicitlySet((DialogLabel)(this->options).value.ptr);
    if (cVar6 != '\0') {
      QFileDialogOptions::labelText((DialogLabel)&local_c8);
      pUVar1 = (this->qFileDialogUi).d;
      if (pUVar1 != (Ui_QFileDialog *)0x0) {
        QLabel::setText(pUVar1->fileTypeLabel,&local_c8.a);
      }
      if (&(local_c8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_c8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_c8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_c8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_c8.a.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    updateCancelButtonText(this);
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,8,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileDialogPrivate::retranslateStrings()
{
    Q_Q(QFileDialog);
    /* WIDGETS */
    if (options->useDefaultNameFilters())
        q->setNameFilter(QFileDialogOptions::defaultNameFilterString());
    if (!usingWidgets())
        return;

    QList<QAction*> actions = qFileDialogUi->treeView->header()->actions();
    QAbstractItemModel *abstractModel = model;
#if QT_CONFIG(proxymodel)
    if (proxyModel)
        abstractModel = proxyModel;
#endif
    const int total = qMin(abstractModel->columnCount(QModelIndex()), int(actions.size() + 1));
    for (int i = 1; i < total; ++i) {
        actions.at(i - 1)->setText(QFileDialog::tr("Show ") + abstractModel->headerData(i, Qt::Horizontal, Qt::DisplayRole).toString());
    }

    /* MENU ACTIONS */
    renameAction->setText(QFileDialog::tr("&Rename"));
    deleteAction->setText(QFileDialog::tr("&Delete"));
    showHiddenAction->setText(QFileDialog::tr("Show &hidden files"));
    newFolderAction->setText(QFileDialog::tr("&New Folder"));
    qFileDialogUi->retranslateUi(q);
    updateLookInLabel();
    updateFileNameLabel();
    updateFileTypeLabel();
    updateCancelButtonText();
}